

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

bool __thiscall
bssl::InplaceVector<unsigned_char,_64UL>::TryResize
          (InplaceVector<unsigned_char,_64UL> *this,size_t new_size)

{
  size_t sVar1;
  uchar *puVar2;
  size_t new_size_local;
  InplaceVector<unsigned_char,_64UL> *this_local;
  
  if (this->size_ < new_size) {
    sVar1 = capacity();
    if (sVar1 < new_size) {
      this_local._7_1_ = false;
    }
    else {
      puVar2 = data(this);
      std::uninitialized_value_construct_n<unsigned_char*,unsigned_long>
                (puVar2 + (int)(uint)this->size_,new_size - this->size_);
      this->size_ = (PackedSize<64UL>)new_size;
      this_local._7_1_ = true;
    }
  }
  else {
    Shrink(this,new_size);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] bool TryResize(size_t new_size) {
    if (new_size <= size_) {
      Shrink(new_size);
      return true;
    }
    if (new_size > capacity()) {
      return false;
    }
    std::uninitialized_value_construct_n(data() + size_, new_size - size_);
    size_ = static_cast<PackedSize<N>>(new_size);
    return true;
  }